

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O1

void __thiscall Imf_2_5::Header::insert(Header *this,char *name,Attribute *attribute)

{
  int iVar1;
  iterator iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *ppAVar4;
  ArgExc *this_00;
  undefined4 extraout_var_02;
  ostream *poVar5;
  size_t sVar6;
  TypeExc *this_01;
  stringstream _iex_throw_s;
  key_type kStack_1a8;
  
  if (*name == '\0') {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&kStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(kStack_1a8._text + 0x10),
               "Image attribute name cannot be an empty string.",0x2f);
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)&kStack_1a8);
    __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  strncpy(kStack_1a8._text,name,0xff);
  kStack_1a8._text[0xff] = '\0';
  iVar2 = std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
          ::find((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
                  *)this,&kStack_1a8);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = (*attribute->_vptr_Attribute[3])(attribute);
    strncpy(kStack_1a8._text,name,0xff);
    kStack_1a8._text[0xff] = '\0';
    ppAVar4 = std::
              map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
              ::operator[](&this->_map,&kStack_1a8);
    *ppAVar4 = (mapped_type)CONCAT44(extraout_var_01,iVar1);
  }
  else {
    pcVar3 = (char *)(**(code **)(**(long **)(iVar2._M_node + 9) + 0x10))();
    iVar1 = (*attribute->_vptr_Attribute[2])(attribute);
    iVar1 = strcmp(pcVar3,(char *)CONCAT44(extraout_var,iVar1));
    if (iVar1 != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&kStack_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(kStack_1a8._text + 0x10),"Cannot assign a value of type \"",0x1f);
      iVar1 = (*attribute->_vptr_Attribute[2])(attribute);
      poVar5 = std::operator<<((ostream *)(kStack_1a8._text + 0x10),
                               (char *)CONCAT44(extraout_var_02,iVar1));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" to image attribute \"",0x16);
      sVar6 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,name,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" of type \"",0xb);
      pcVar3 = (char *)(**(code **)(**(long **)(iVar2._M_node + 9) + 0x10))();
      poVar5 = std::operator<<(poVar5,pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
      this_01 = (TypeExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::TypeExc::TypeExc(this_01,(stringstream *)&kStack_1a8);
      __cxa_throw(this_01,&Iex_2_5::TypeExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
    iVar1 = (*attribute->_vptr_Attribute[3])(attribute);
    if (*(long **)(iVar2._M_node + 9) != (long *)0x0) {
      (**(code **)(**(long **)(iVar2._M_node + 9) + 8))();
    }
    *(ulong *)(iVar2._M_node + 9) = CONCAT44(extraout_var_00,iVar1);
  }
  return;
}

Assistant:

void
Header::insert (const char name[], const Attribute &attribute)
{
    if (name[0] == 0)
	THROW (IEX_NAMESPACE::ArgExc, "Image attribute name cannot be an empty string.");

    AttributeMap::iterator i = _map.find (name);

    if (i == _map.end())
    {
	Attribute *tmp = attribute.copy();

	try
	{
	    _map[name] = tmp;
	}
	catch (...)
	{
	    delete tmp;
	    throw;
	}
    }
    else
    {
	if (strcmp (i->second->typeName(), attribute.typeName()))
	    THROW (IEX_NAMESPACE::TypeExc, "Cannot assign a value of "
				 "type \"" << attribute.typeName() << "\" "
				 "to image attribute \"" << name << "\" of "
				 "type \"" << i->second->typeName() << "\".");

	Attribute *tmp = attribute.copy();
	delete i->second;
	i->second = tmp;
    }
}